

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

string * __thiscall
cfd::core::CryptoUtil::EncodeBase64_abi_cxx11_
          (string *__return_storage_ptr__,CryptoUtil *this,ByteData *data)

{
  char cVar1;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> src;
  string cdst;
  
  ByteData::GetBytes(&src,(ByteData *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  uVar2 = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cdst._M_dataplus._M_p = (pointer)&cdst.field_2;
  cdst._M_string_length = 0;
  cdst.field_2._M_local_buf[0] = '\0';
  while (uVar2 < (ulong)((long)src.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)src.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start)) {
    cVar1 = (char)&cdst;
    if (uVar2 % 3 == 2) {
      ::std::__cxx11::string::push_back(cVar1);
      ::std::__cxx11::string::push_back(cVar1);
      uVar2 = uVar2 + 1;
    }
    else if (uVar2 % 3 == 1) {
      ::std::__cxx11::string::push_back(cVar1);
      uVar2 = uVar2 + 1;
      if (uVar2 == (long)src.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)src.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) {
        ::std::__cxx11::string::push_back(cVar1);
        ::std::__cxx11::string::push_back(cVar1);
      }
    }
    else {
      ::std::__cxx11::string::push_back(cVar1);
      uVar2 = uVar2 + 1;
      if (uVar2 == (long)src.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)src.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) {
        ::std::__cxx11::string::push_back(cVar1);
        ::std::__cxx11::string::push_back(cVar1);
        ::std::__cxx11::string::push_back(cVar1);
      }
    }
  }
  ::std::__cxx11::string::swap((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&cdst);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&src.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string CryptoUtil::EncodeBase64(const ByteData &data) {
  std::vector<uint8_t> src(data.GetBytes());
  std::string dst;
  std::string cdst;

  for (std::size_t i = 0; i < src.size(); ++i) {
    switch (i % 3) {
      case 0:
        cdst.push_back(kBase64EncodeTable[(src[i] & 0xFC) >> 2]);
        if (i + 1 == src.size()) {
          cdst.push_back(kBase64EncodeTable[(src[i] & 0x03) << 4]);
          cdst.push_back('=');
          cdst.push_back('=');
        }

        break;
      case 1:
        cdst.push_back(
            kBase64EncodeTable
                [((src[i - 1] & 0x03) << 4) | ((src[i + 0] & 0xF0) >> 4)]);
        if (i + 1 == src.size()) {
          cdst.push_back(kBase64EncodeTable[(src[i] & 0x0F) << 2]);
          cdst.push_back('=');
        }

        break;
      case 2:
        cdst.push_back(
            kBase64EncodeTable
                [((src[i - 1] & 0x0F) << 2) | ((src[i + 0] & 0xC0) >> 6)]);
        cdst.push_back(kBase64EncodeTable[src[i] & 0x3F]);

        break;
    }
  }

  dst.swap(cdst);
  return dst;
}